

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O0

void __thiscall
Test::TextOutput::finishTestMethod
          (TextOutput *this,string *suiteName,string *methodName,string *argString,bool withSuccess)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_51;
  string local_50 [39];
  byte local_29;
  string *psStack_28;
  bool withSuccess_local;
  string *argString_local;
  string *methodName_local;
  string *suiteName_local;
  TextOutput *this_local;
  
  if ((this->mode < 2) || ((this->mode < 3 && (!withSuccess)))) {
    local_29 = withSuccess;
    psStack_28 = argString;
    argString_local = methodName;
    methodName_local = suiteName;
    suiteName_local = (string *)this;
    poVar2 = std::operator<<(this->stream,"Test-method \'");
    poVar2 = std::operator<<(poVar2,(string *)argString_local);
    poVar2 = std::operator<<(poVar2,'(');
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (psStack_28);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"",&local_51);
    }
    else {
      std::__cxx11::string::string(local_50,psStack_28);
    }
    poVar2 = std::operator<<(poVar2,local_50);
    poVar2 = std::operator<<(poVar2,")\' finished with ");
    pcVar3 = "errors!";
    if ((local_29 & 1) != 0) {
      pcVar3 = "success!";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
    if (bVar1) {
      std::allocator<char>::~allocator(&local_51);
    }
  }
  return;
}

Assistant:

void TextOutput::finishTestMethod(
    const std::string &suiteName, const std::string &methodName, const std::string &argString, const bool withSuccess) {
  if (mode <= Debug || (mode <= Verbose && !withSuccess))
    stream << "Test-method '" << methodName << '(' << (argString.empty() ? "" : argString) << ")' finished with "
           << (withSuccess ? "success!" : "errors!") << std::endl;
}